

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O1

size_t coda_base58_encode_alloc(char *in,size_t inlen,char **out)

{
  size_t sVar1;
  char *out_00;
  size_t sVar2;
  ulong uVar3;
  
  sVar1 = inlen;
  if (inlen == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      if (in[sVar2] != '\0') goto LAB_00101809;
      sVar2 = sVar2 + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    sVar1 = 0;
    sVar2 = inlen;
  }
LAB_00101809:
  uVar3 = (sVar1 * 0x8a) / 100;
  sVar1 = uVar3 + sVar2 + 2;
  out_00 = (char *)malloc(sVar1);
  *out = out_00;
  if (out_00 != (char *)0x0) {
    coda_base58_encode(in,inlen,out_00,sVar1);
    sVar1 = uVar3 + sVar2 + 1;
  }
  return sVar1;
}

Assistant:

size_t coda_base58_encode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t nonzero_inlen = inlen;
    while (nonzero_inlen && !in[zeroes])
    {
        zeroes++;
        nonzero_inlen--;
    }

    size_t outlen = zeroes + nonzero_inlen * 138 / 100 + 2;

    *out = malloc (outlen);
    if (!*out)
        return outlen;

    coda_base58_encode (in, inlen, *out, outlen);
    return outlen - 1;
}